

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

void __thiscall
sjtu::map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_>::clear
          (map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_> *this,Node **x)

{
  map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_> *in_RSI;
  Node **in_RDI;
  Node *this_00;
  
  if (in_RSI->nil != *in_RDI) {
    if (in_RSI->nil->parent == *in_RDI) {
      in_RDI[1] = *in_RDI;
    }
    clear(in_RSI,in_RDI);
    clear(in_RSI,in_RDI);
    this_00 = in_RSI->nil;
    if (this_00 != (Node *)0x0) {
      Node::~Node(this_00);
      operator_delete(this_00,0x28);
    }
    in_RSI->nil = *in_RDI;
    in_RDI[3] = (Node *)((long)&in_RDI[3][-1].parent + 7);
  }
  return;
}

Assistant:

void clear(Node *&x)
	{
		if (x == nil) return;
		if (x -> parent == nil) nodebegin = nil;
		clear(x -> left) , clear(x -> right) , delete x , x = nil , -- tot;
	}